

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_crc32(DisasContext_conflict1 *s,arg_rrr *a,_Bool c,MemOp sz)

{
  uint uVar1;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 var;
  TCGv_i32 ret;
  TCGv_i32 pTVar2;
  code *func;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  uVar1 = s->isar->id_isar5;
  if ((uVar1 & 0xf0000) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    var = load_reg(s,a->rn);
    ret = load_reg(s,a->rm);
    if (sz != MO_32) {
      if (sz == MO_16) {
        tcg_gen_ext16u_i32_aarch64(tcg_ctx,ret,ret);
      }
      else {
        tcg_gen_ext8u_i32_aarch64(tcg_ctx,ret,ret);
      }
    }
    pTVar2 = tcg_const_i32_aarch64(tcg_ctx,1 << ((byte)sz & 0x1f));
    local_48 = (TCGTemp *)(var + (long)tcg_ctx);
    if (c) {
      func = helper_crc32c_aarch64;
    }
    else {
      func = helper_crc32_aarch64;
    }
    local_40 = (TCGTemp *)(ret + (long)tcg_ctx);
    local_38 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    tcg_gen_callN_aarch64(tcg_ctx,func,local_48,3,&local_48);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    store_reg(s,a->rd,var);
  }
  return (uVar1 & 0xf0000) != 0;
}

Assistant:

static bool op_crc32(DisasContext *s, arg_rrr *a, bool c, MemOp sz)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2, t3;

    if (!dc_isar_feature(aa32_crc32, s)) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    switch (sz) {
    case MO_8:
        gen_uxtb(t2);
        break;
    case MO_16:
        gen_uxth(t2);
        break;
    case MO_32:
        break;
    default:
        g_assert_not_reached();
        break;
    }
    t3 = tcg_const_i32(tcg_ctx, 1 << sz);
    if (c) {
        gen_helper_crc32c(tcg_ctx, t1, t1, t2, t3);
    } else {
        gen_helper_crc32(tcg_ctx, t1, t1, t2, t3);
    }
    tcg_temp_free_i32(tcg_ctx, t2);
    tcg_temp_free_i32(tcg_ctx, t3);
    store_reg(s, a->rd, t1);
    return true;
}